

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

void __thiscall cppwinrt::writer::write_root_include(writer *this,string_view *include)

{
  char local_41;
  char local_33;
  char local_32;
  char local_31;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  char *local_20;
  char *format;
  string_view *include_local;
  writer *this_local;
  
  local_20 = "#include %winrt/%.h%\n";
  format = (char *)include;
  include_local = (string_view *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"#include %winrt/%.h%\n");
  local_33 = '<';
  if ((settings[0xa8] & 1) == 0) {
    local_33 = '\"';
  }
  local_31 = local_33;
  local_41 = '>';
  if ((settings[0xa8] & 1) == 0) {
    local_41 = '\"';
  }
  local_32 = local_41;
  writer_base<cppwinrt::writer>::
  write<char,std::basic_string_view<char,std::char_traits<char>>,char>
            (&this->super_writer_base<cppwinrt::writer>,&local_30,&local_31,
             (basic_string_view<char,_std::char_traits<char>_> *)format,&local_32);
  return;
}

Assistant:

void write_root_include(std::string_view const& include)
        {
            auto format = R"(#include %winrt/%.h%
)";

            write(format,
                settings.brackets ? '<' : '\"',
                include,
                settings.brackets ? '>' : '\"');
        }